

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LessEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_lessequal(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LessEqualLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_lessequal(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_lessequal(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LessEqualLayerParams>(arena);
    (this->layer_).lessequal_ = pLVar2;
  }
  return (LessEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LessEqualLayerParams* NeuralNetworkLayer::_internal_mutable_lessequal() {
  if (!_internal_has_lessequal()) {
    clear_layer();
    set_has_lessequal();
    layer_.lessequal_ = CreateMaybeMessage< ::CoreML::Specification::LessEqualLayerParams >(GetArenaForAllocation());
  }
  return layer_.lessequal_;
}